

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O2

char * rapidjson::internal::Prettify(char *buffer,int length,int k,int maxDecimalPlaces)

{
  int i;
  char *pcVar1;
  undefined4 in_register_0000000c;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = k + length;
  pcVar4 = (char *)CONCAT71((int7)(CONCAT44(in_register_0000000c,maxDecimalPlaces) >> 8),
                            (int)uVar6 < 0x16 && -1 < k);
  if ((int)uVar6 < 0x16 && -1 < k) {
    for (lVar2 = (long)length; lVar2 < (int)uVar6; lVar2 = lVar2 + 1) {
      buffer[lVar2] = '0';
    }
    pcVar4 = buffer + (int)uVar6;
    pcVar4[0] = '.';
    pcVar4[1] = '0';
    pcVar1 = pcVar4 + 2;
  }
  else if (uVar6 - 1 < 0x15) {
    memmove(buffer + uVar6 + 1,buffer + uVar6,(long)-k);
    buffer[uVar6] = '.';
    if (k + maxDecimalPlaces < 0) {
      for (uVar3 = (ulong)(int)(maxDecimalPlaces + uVar6); (int)(uVar6 + 1) < (int)uVar3;
          uVar3 = uVar3 - 1) {
        if (buffer[uVar3 & 0xffffffff] != '0') {
          return buffer + uVar3 + 1;
        }
      }
      pcVar1 = buffer + uVar6 + 2;
    }
    else {
      pcVar1 = buffer + (long)length + 1;
    }
  }
  else if (uVar6 + 5 < 6) {
    uVar6 = 2 - uVar6;
    memmove(buffer + uVar6,buffer,(long)length);
    buffer[0] = '0';
    buffer[1] = '.';
    for (uVar3 = 2; uVar3 < uVar6; uVar3 = uVar3 + 1) {
      buffer[uVar3] = '0';
    }
    if (maxDecimalPlaces < -k) {
      uVar6 = maxDecimalPlaces + 1;
      do {
        uVar5 = uVar6;
        pcVar1 = (char *)(ulong)uVar5;
        if ((int)uVar5 < 3) goto LAB_001efb60;
        pcVar4 = pcVar1;
        uVar6 = uVar5 - 1;
      } while (buffer[(long)pcVar1] == '0');
      pcVar4 = pcVar1 + (long)buffer + 1;
LAB_001efb60:
      pcVar1 = buffer + 3;
      if (2 < (int)uVar5) {
        pcVar1 = pcVar4;
      }
    }
    else {
      pcVar1 = buffer + (int)(uVar6 + length);
    }
  }
  else {
    if (SBORROW4(uVar6,-maxDecimalPlaces) == (int)(uVar6 + maxDecimalPlaces) < 0) {
      if (length == 1) {
        buffer[1] = 'e';
        pcVar4 = buffer + 2;
      }
      else {
        memmove(buffer + 2,buffer + 1,(long)(length + -1));
        buffer[1] = '.';
        pcVar4 = buffer + (long)length + 2;
        buffer[(long)length + 1] = 'e';
      }
      pcVar4 = WriteExponent(uVar6 - 1,pcVar4);
      return pcVar4;
    }
    buffer[0] = '0';
    buffer[1] = '.';
    buffer[2] = '0';
    pcVar1 = buffer + 3;
  }
  return pcVar1;
}

Assistant:

inline char* Prettify(char* buffer, int length, int k, int maxDecimalPlaces) {
    const int kk = length + k;  // 10^(kk-1) <= v < 10^kk

    if (0 <= k && kk <= 21) {
        // 1234e7 -> 12340000000
        for (int i = length; i < kk; i++)
            buffer[i] = '0';
        buffer[kk] = '.';
        buffer[kk + 1] = '0';
        return &buffer[kk + 2];
    }
    else if (0 < kk && kk <= 21) {
        // 1234e-2 -> 12.34
        std::memmove(&buffer[kk + 1], &buffer[kk], static_cast<size_t>(length - kk));
        buffer[kk] = '.';
        if (0 > k + maxDecimalPlaces) {
            // When maxDecimalPlaces = 2, 1.2345 -> 1.23, 1.102 -> 1.1
            // Remove extra trailing zeros (at least one) after truncation.
            for (int i = kk + maxDecimalPlaces; i > kk + 1; i--)
                if (buffer[i] != '0')
                    return &buffer[i + 1];
            return &buffer[kk + 2]; // Reserve one zero
        }
        else
            return &buffer[length + 1];
    }
    else if (-6 < kk && kk <= 0) {
        // 1234e-6 -> 0.001234
        const int offset = 2 - kk;
        std::memmove(&buffer[offset], &buffer[0], static_cast<size_t>(length));
        buffer[0] = '0';
        buffer[1] = '.';
        for (int i = 2; i < offset; i++)
            buffer[i] = '0';
        if (length - kk > maxDecimalPlaces) {
            // When maxDecimalPlaces = 2, 0.123 -> 0.12, 0.102 -> 0.1
            // Remove extra trailing zeros (at least one) after truncation.
            for (int i = maxDecimalPlaces + 1; i > 2; i--)
                if (buffer[i] != '0')
                    return &buffer[i + 1];
            return &buffer[3]; // Reserve one zero
        }
        else
            return &buffer[length + offset];
    }
    else if (kk < -maxDecimalPlaces) {
        // Truncate to zero
        buffer[0] = '0';
        buffer[1] = '.';
        buffer[2] = '0';
        return &buffer[3];
    }
    else if (length == 1) {
        // 1e30
        buffer[1] = 'e';
        return WriteExponent(kk - 1, &buffer[2]);
    }
    else {
        // 1234e30 -> 1.234e33
        std::memmove(&buffer[2], &buffer[1], static_cast<size_t>(length - 1));
        buffer[1] = '.';
        buffer[length + 1] = 'e';
        return WriteExponent(kk - 1, &buffer[0 + length + 2]);
    }
}